

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZHelpers.h
# Opt level: O2

void s_send<std::__cxx11::string>
               (socket_t *socket,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
               string_view trace,int flags)

{
  bool bVar1;
  runtime_error *this;
  allocator<char> local_69;
  string_view trace_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  trace_local._M_str = trace._M_str;
  trace_local._M_len = trace._M_len;
  bVar1 = s_try_send<std::__cxx11::string>(socket,value,flags);
  if (bVar1) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_58,&trace_local,&local_69);
  std::operator+(&local_38,"s_send failed ",&local_58);
  std::runtime_error::runtime_error(this,(string *)&local_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void s_send(zmq::socket_t *socket, const T &value, std::string_view trace,
            int flags = 0) {
    if (!s_try_send<T>(socket, value, flags)) {
        throw std::runtime_error("s_send failed " + std::string(trace));
    }
}